

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgqueue.c
# Opt level: O0

void nn_msgqueue_term(nn_msgqueue *self)

{
  int iVar1;
  char *pcVar2;
  long *in_RDI;
  nn_msg msg;
  int rc;
  FILE *__stream;
  nn_msg *in_stack_ffffffffffffff90;
  nn_msgqueue *in_stack_ffffffffffffff98;
  
  while( true ) {
    iVar1 = nn_msgqueue_recv(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    if (iVar1 == -0xb) break;
    if (iVar1 < 0) {
      nn_backtrace_print();
      __stream = _stderr;
      pcVar2 = nn_err_strerror((int)((ulong)_stderr >> 0x20));
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar2,(ulong)(uint)-iVar1,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/inproc/msgqueue.c"
              ,0x3d);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_msg_term((nn_msg *)0x154637);
  }
  if (in_RDI[2] != *in_RDI) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","self->in.chunk == self->out.chunk",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/inproc/msgqueue.c"
            ,0x43);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_free((void *)0x1546b6);
  if (in_RDI[7] != 0) {
    nn_free((void *)0x1546d0);
  }
  return;
}

Assistant:

void nn_msgqueue_term (struct nn_msgqueue *self)
{
    int rc;
    struct nn_msg msg;

    /*  Deallocate messages in the pipe. */
    while (1) {
        rc = nn_msgqueue_recv (self, &msg);
        if (rc == -EAGAIN)
            break;
        errnum_assert (rc >= 0, -rc);
        nn_msg_term (&msg);
    }

    /*  There are no more messages in the pipe so there's at most one chunk
        in the queue. Deallocate it. */
    nn_assert (self->in.chunk == self->out.chunk);
    nn_free (self->in.chunk);

    /*  Deallocate the cached chunk, if any. */
    if (self->cache)
        nn_free (self->cache);
}